

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tty.c
# Opt level: O1

int run_test_tty(void)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint extraout_EAX;
  undefined1 *puVar4;
  undefined8 uVar5;
  undefined1 *puVar6;
  int *piVar7;
  int height;
  int width;
  uv_tty_t tty_in;
  uv_tty_t tty_out;
  uint uStack_f80;
  uint uStack_f7c;
  undefined1 auStack_f78 [8];
  undefined1 auStack_f70 [90];
  byte bStack_f16;
  undefined1 auStack_e38 [90];
  byte bStack_dde;
  undefined1 auStack_d00 [848];
  undefined1 *puStack_9b0;
  code *pcStack_9a8;
  undefined1 auStack_998 [312];
  undefined1 auStack_860 [312];
  undefined1 auStack_728 [312];
  undefined1 auStack_5f0 [848];
  code *pcStack_2a0;
  uint local_290;
  uint local_28c;
  undefined1 local_288 [312];
  undefined1 local_150 [312];
  
  pcStack_2a0 = (code *)0x177c00;
  puVar4 = (undefined1 *)uv_default_loop();
  pcStack_2a0 = (code *)0x177c15;
  uVar1 = open64("/dev/tty",0,0);
  if (-1 < (int)uVar1) {
    piVar7 = (int *)(ulong)uVar1;
    pcStack_2a0 = (code *)0x177c35;
    iVar2 = open64("/dev/tty",1,0);
    if (-1 < iVar2) {
      pcStack_2a0 = (code *)0x177c49;
      iVar3 = uv_guess_handle(0xffffffff);
      if (iVar3 == 0) {
        pcStack_2a0 = (code *)0x177c59;
        iVar3 = uv_guess_handle(piVar7);
        if (iVar3 != 0xe) goto LAB_00177e95;
        pcStack_2a0 = (code *)0x177c69;
        iVar3 = uv_guess_handle(iVar2);
        if (iVar3 != 0xe) goto LAB_00177e9a;
        pcStack_2a0 = (code *)0x177c77;
        uVar5 = uv_default_loop();
        pcStack_2a0 = (code *)0x177c8c;
        iVar3 = uv_tty_init(uVar5,local_288,uVar1,1);
        if (iVar3 != 0) goto LAB_00177e9f;
        pcStack_2a0 = (code *)0x177c9e;
        iVar3 = uv_is_readable(local_288);
        if (iVar3 == 0) goto LAB_00177ea4;
        pcStack_2a0 = (code *)0x177cb0;
        iVar3 = uv_is_writable(local_288);
        if (iVar3 != 0) goto LAB_00177ea9;
        pcStack_2a0 = (code *)0x177cbd;
        uVar5 = uv_default_loop();
        pcStack_2a0 = (code *)0x177cd1;
        iVar2 = uv_tty_init(uVar5,local_150,iVar2,0);
        if (iVar2 != 0) goto LAB_00177eae;
        pcStack_2a0 = (code *)0x177ce6;
        iVar2 = uv_is_readable(local_150);
        if (iVar2 != 0) goto LAB_00177eb3;
        pcStack_2a0 = (code *)0x177cfb;
        iVar2 = uv_is_writable(local_150);
        if (iVar2 == 0) goto LAB_00177eb8;
        pcStack_2a0 = (code *)0x177d1a;
        iVar2 = uv_tty_get_winsize(local_150,&local_28c,&local_290);
        if (iVar2 != 0) goto LAB_00177ebd;
        pcStack_2a0 = (code *)0x177d38;
        printf("width=%d height=%d\n",(ulong)local_28c,(ulong)local_290);
        if (local_28c == 0 && local_290 == 0) {
          pcStack_2a0 = (code *)0x177d4b;
          puVar4 = (undefined1 *)uv_default_loop();
          pcStack_2a0 = (code *)0x177d5f;
          uv_walk(puVar4,close_walk_cb,0);
          pcStack_2a0 = (code *)0x177d69;
          uv_run(puVar4);
          pcStack_2a0 = (code *)0x177d6e;
          uVar5 = uv_default_loop();
          pcStack_2a0 = (code *)0x177d76;
          iVar2 = uv_loop_close(uVar5);
          piVar7 = (int *)0x1;
          if (iVar2 == 0) goto LAB_00177e81;
          pcStack_2a0 = (code *)0x177d89;
          run_test_tty_cold_18();
          local_290 = extraout_EAX;
        }
        if ((int)local_28c < 0xb) goto LAB_00177ec2;
        if ((int)local_290 < 0xb) goto LAB_00177ec7;
        pcStack_2a0 = (code *)0x177daa;
        iVar2 = uv_tty_set_mode(local_288);
        if (iVar2 != 0) goto LAB_00177ecc;
        pcStack_2a0 = (code *)0x177dbe;
        iVar2 = uv_tty_set_mode(local_288);
        if (iVar2 != 0) goto LAB_00177ed1;
        pcStack_2a0 = (code *)0x177dcb;
        piVar7 = __errno_location();
        *piVar7 = 0;
        pcStack_2a0 = (code *)0x177dd9;
        iVar2 = uv_tty_reset_mode();
        if (iVar2 != 0) goto LAB_00177ed6;
        pcStack_2a0 = (code *)0x177de6;
        iVar2 = uv_tty_reset_mode();
        if (iVar2 != 0) goto LAB_00177edb;
        pcStack_2a0 = (code *)0x177df3;
        iVar2 = uv_tty_reset_mode();
        if (iVar2 != 0) goto LAB_00177ee0;
        if (*piVar7 == 0) {
          piVar7 = (int *)0x0;
          pcStack_2a0 = (code *)0x177e14;
          uv_close(local_288,0);
          pcStack_2a0 = (code *)0x177e23;
          uv_close(local_150,0);
          pcStack_2a0 = (code *)0x177e2d;
          uv_run(puVar4,0);
          pcStack_2a0 = (code *)0x177e32;
          uVar5 = uv_default_loop();
          pcStack_2a0 = (code *)0x177e46;
          uv_walk(uVar5,close_walk_cb,0);
          pcStack_2a0 = (code *)0x177e50;
          uv_run(uVar5,0);
          pcStack_2a0 = (code *)0x177e55;
          uVar5 = uv_default_loop();
          pcStack_2a0 = (code *)0x177e5d;
          iVar2 = uv_loop_close(uVar5);
          if (iVar2 == 0) goto LAB_00177e81;
          pcStack_2a0 = (code *)0x177e66;
          run_test_tty_cold_17();
          goto LAB_00177e76;
        }
      }
      else {
        pcStack_2a0 = (code *)0x177e95;
        run_test_tty_cold_1();
LAB_00177e95:
        pcStack_2a0 = (code *)0x177e9a;
        run_test_tty_cold_2();
LAB_00177e9a:
        pcStack_2a0 = (code *)0x177e9f;
        run_test_tty_cold_3();
LAB_00177e9f:
        pcStack_2a0 = (code *)0x177ea4;
        run_test_tty_cold_4();
LAB_00177ea4:
        pcStack_2a0 = (code *)0x177ea9;
        run_test_tty_cold_20();
LAB_00177ea9:
        pcStack_2a0 = (code *)0x177eae;
        run_test_tty_cold_5();
LAB_00177eae:
        pcStack_2a0 = (code *)0x177eb3;
        run_test_tty_cold_6();
LAB_00177eb3:
        pcStack_2a0 = (code *)0x177eb8;
        run_test_tty_cold_7();
LAB_00177eb8:
        pcStack_2a0 = (code *)0x177ebd;
        run_test_tty_cold_19();
LAB_00177ebd:
        pcStack_2a0 = (code *)0x177ec2;
        run_test_tty_cold_8();
LAB_00177ec2:
        pcStack_2a0 = (code *)0x177ec7;
        run_test_tty_cold_9();
LAB_00177ec7:
        pcStack_2a0 = (code *)0x177ecc;
        run_test_tty_cold_10();
LAB_00177ecc:
        pcStack_2a0 = (code *)0x177ed1;
        run_test_tty_cold_11();
LAB_00177ed1:
        pcStack_2a0 = (code *)0x177ed6;
        run_test_tty_cold_12();
LAB_00177ed6:
        pcStack_2a0 = (code *)0x177edb;
        run_test_tty_cold_13();
LAB_00177edb:
        pcStack_2a0 = (code *)0x177ee0;
        run_test_tty_cold_14();
LAB_00177ee0:
        pcStack_2a0 = (code *)0x177ee5;
        run_test_tty_cold_15();
      }
      pcStack_2a0 = run_test_tty_file;
      run_test_tty_cold_16();
      pcStack_9a8 = (code *)0x177eff;
      pcStack_2a0 = (code *)puVar4;
      iVar2 = uv_loop_init(auStack_5f0);
      if (iVar2 == 0) {
        pcStack_9a8 = (code *)0x177f17;
        uVar1 = open64("test/fixtures/empty_file",0);
        if (uVar1 != 0xffffffff) {
          puVar4 = (undefined1 *)(ulong)uVar1;
          pcStack_9a8 = (code *)0x177f37;
          iVar2 = uv_tty_init(auStack_5f0,auStack_998,uVar1,1);
          if (iVar2 != -0x16) goto LAB_00178257;
          pcStack_9a8 = (code *)0x177f47;
          iVar2 = close(uVar1);
          if (iVar2 == 0) goto LAB_00177f4f;
          goto LAB_0017825c;
        }
LAB_00177f4f:
        pcStack_9a8 = (code *)0x177f5f;
        uVar1 = open64("/dev/random",0);
        if (uVar1 != 0xffffffff) {
          puVar4 = (undefined1 *)(ulong)uVar1;
          pcStack_9a8 = (code *)0x177f7f;
          iVar2 = uv_tty_init(auStack_5f0,auStack_998,uVar1,1);
          if (iVar2 != -0x16) goto LAB_00178261;
          pcStack_9a8 = (code *)0x177f8f;
          iVar2 = close(uVar1);
          if (iVar2 == 0) goto LAB_00177f97;
          goto LAB_00178266;
        }
LAB_00177f97:
        pcStack_9a8 = (code *)0x177fa7;
        uVar1 = open64("/dev/zero",0);
        if (uVar1 != 0xffffffff) {
          puVar4 = (undefined1 *)(ulong)uVar1;
          pcStack_9a8 = (code *)0x177fc7;
          iVar2 = uv_tty_init(auStack_5f0,auStack_998,uVar1,1);
          if (iVar2 != -0x16) goto LAB_0017826b;
          pcStack_9a8 = (code *)0x177fd7;
          iVar2 = close(uVar1);
          if (iVar2 == 0) goto LAB_00177fdf;
          goto LAB_00178270;
        }
LAB_00177fdf:
        pcStack_9a8 = (code *)0x177ff2;
        uVar1 = open64("/dev/tty",2);
        if (uVar1 != 0xffffffff) {
          puVar4 = (undefined1 *)(ulong)uVar1;
          pcStack_9a8 = (code *)0x178016;
          iVar2 = uv_tty_init(auStack_5f0,auStack_998,uVar1,1);
          if (iVar2 != 0) goto LAB_00178275;
          pcStack_9a8 = (code *)0x178025;
          iVar2 = close(uVar1);
          if (iVar2 != 0) goto LAB_0017827a;
          pcStack_9a8 = (code *)0x178037;
          iVar2 = uv_is_readable(auStack_998);
          if (iVar2 == 0) goto LAB_0017827f;
          pcStack_9a8 = (code *)0x178049;
          iVar2 = uv_is_writable(auStack_998);
          if (iVar2 == 0) goto LAB_00178284;
          puVar4 = auStack_998;
          pcStack_9a8 = (code *)0x178060;
          uv_close(puVar4);
          pcStack_9a8 = (code *)0x178068;
          iVar2 = uv_is_readable(puVar4);
          if (iVar2 != 0) goto LAB_0017828e;
          pcStack_9a8 = (code *)0x17807a;
          iVar2 = uv_is_writable(auStack_998);
          if (iVar2 == 0) goto LAB_00178082;
          goto LAB_00178298;
        }
LAB_00178082:
        pcStack_9a8 = (code *)0x178092;
        uVar1 = open64("/dev/tty",0);
        if (uVar1 != 0xffffffff) {
          puVar4 = (undefined1 *)(ulong)uVar1;
          pcStack_9a8 = (code *)0x1780b9;
          iVar2 = uv_tty_init(auStack_5f0,auStack_728,uVar1,1);
          if (iVar2 != 0) goto LAB_00178289;
          pcStack_9a8 = (code *)0x1780c8;
          iVar2 = close(uVar1);
          if (iVar2 != 0) goto LAB_00178293;
          pcStack_9a8 = (code *)0x1780dd;
          iVar2 = uv_is_readable(auStack_728);
          if (iVar2 == 0) goto LAB_0017829d;
          pcStack_9a8 = (code *)0x1780f2;
          iVar2 = uv_is_writable(auStack_728);
          if (iVar2 != 0) goto LAB_001782a2;
          puVar4 = auStack_728;
          pcStack_9a8 = (code *)0x17810c;
          uv_close(puVar4,0);
          pcStack_9a8 = (code *)0x178114;
          iVar2 = uv_is_readable(puVar4);
          if (iVar2 != 0) goto LAB_001782ac;
          pcStack_9a8 = (code *)0x178129;
          iVar2 = uv_is_writable(auStack_728);
          if (iVar2 == 0) goto LAB_00178131;
          goto LAB_001782b6;
        }
LAB_00178131:
        pcStack_9a8 = (code *)0x178144;
        uVar1 = open64("/dev/tty",1);
        if (uVar1 == 0xffffffff) {
LAB_001781e0:
          pcStack_9a8 = (code *)0x1781ef;
          iVar2 = uv_run(auStack_5f0,0);
          if (iVar2 != 0) goto LAB_00178248;
          pcStack_9a8 = (code *)0x178200;
          iVar2 = uv_loop_close(auStack_5f0);
          if (iVar2 != 0) goto LAB_0017824d;
          pcStack_9a8 = (code *)0x178209;
          puVar4 = (undefined1 *)uv_default_loop();
          pcStack_9a8 = (code *)0x17821d;
          uv_walk(puVar4,close_walk_cb,0);
          pcStack_9a8 = (code *)0x178227;
          uv_run(puVar4,0);
          pcStack_9a8 = (code *)0x17822c;
          uVar5 = uv_default_loop();
          pcStack_9a8 = (code *)0x178234;
          iVar2 = uv_loop_close(uVar5);
          if (iVar2 == 0) {
            return 0;
          }
          goto LAB_00178252;
        }
        puVar4 = (undefined1 *)(ulong)uVar1;
        pcStack_9a8 = (code *)0x178168;
        iVar2 = uv_tty_init(auStack_5f0,auStack_860,uVar1,0);
        if (iVar2 != 0) goto LAB_001782a7;
        pcStack_9a8 = (code *)0x178177;
        iVar2 = close(uVar1);
        if (iVar2 != 0) goto LAB_001782b1;
        pcStack_9a8 = (code *)0x17818c;
        iVar2 = uv_is_readable(auStack_860);
        if (iVar2 != 0) goto LAB_001782bb;
        pcStack_9a8 = (code *)0x1781a1;
        iVar2 = uv_is_writable(auStack_860);
        if (iVar2 == 0) goto LAB_001782c0;
        puVar4 = auStack_860;
        pcStack_9a8 = (code *)0x1781bb;
        uv_close(puVar4,0);
        pcStack_9a8 = (code *)0x1781c3;
        iVar2 = uv_is_readable(puVar4);
        if (iVar2 != 0) goto LAB_001782c5;
        pcStack_9a8 = (code *)0x1781d8;
        iVar2 = uv_is_writable(auStack_860);
        if (iVar2 == 0) goto LAB_001781e0;
      }
      else {
        pcStack_9a8 = (code *)0x178248;
        run_test_tty_file_cold_1();
LAB_00178248:
        pcStack_9a8 = (code *)0x17824d;
        run_test_tty_file_cold_26();
LAB_0017824d:
        pcStack_9a8 = (code *)0x178252;
        run_test_tty_file_cold_27();
LAB_00178252:
        pcStack_9a8 = (code *)0x178257;
        run_test_tty_file_cold_28();
LAB_00178257:
        pcStack_9a8 = (code *)0x17825c;
        run_test_tty_file_cold_2();
LAB_0017825c:
        pcStack_9a8 = (code *)0x178261;
        run_test_tty_file_cold_3();
LAB_00178261:
        pcStack_9a8 = (code *)0x178266;
        run_test_tty_file_cold_4();
LAB_00178266:
        pcStack_9a8 = (code *)0x17826b;
        run_test_tty_file_cold_5();
LAB_0017826b:
        pcStack_9a8 = (code *)0x178270;
        run_test_tty_file_cold_6();
LAB_00178270:
        pcStack_9a8 = (code *)0x178275;
        run_test_tty_file_cold_7();
LAB_00178275:
        pcStack_9a8 = (code *)0x17827a;
        run_test_tty_file_cold_8();
LAB_0017827a:
        pcStack_9a8 = (code *)0x17827f;
        run_test_tty_file_cold_9();
LAB_0017827f:
        pcStack_9a8 = (code *)0x178284;
        run_test_tty_file_cold_13();
LAB_00178284:
        pcStack_9a8 = (code *)0x178289;
        run_test_tty_file_cold_12();
LAB_00178289:
        pcStack_9a8 = (code *)0x17828e;
        run_test_tty_file_cold_14();
LAB_0017828e:
        pcStack_9a8 = (code *)0x178293;
        run_test_tty_file_cold_10();
LAB_00178293:
        pcStack_9a8 = (code *)0x178298;
        run_test_tty_file_cold_15();
LAB_00178298:
        pcStack_9a8 = (code *)0x17829d;
        run_test_tty_file_cold_11();
LAB_0017829d:
        pcStack_9a8 = (code *)0x1782a2;
        run_test_tty_file_cold_19();
LAB_001782a2:
        pcStack_9a8 = (code *)0x1782a7;
        run_test_tty_file_cold_16();
LAB_001782a7:
        pcStack_9a8 = (code *)0x1782ac;
        run_test_tty_file_cold_20();
LAB_001782ac:
        pcStack_9a8 = (code *)0x1782b1;
        run_test_tty_file_cold_17();
LAB_001782b1:
        pcStack_9a8 = (code *)0x1782b6;
        run_test_tty_file_cold_21();
LAB_001782b6:
        pcStack_9a8 = (code *)0x1782bb;
        run_test_tty_file_cold_18();
LAB_001782bb:
        pcStack_9a8 = (code *)0x1782c0;
        run_test_tty_file_cold_22();
LAB_001782c0:
        pcStack_9a8 = (code *)0x1782c5;
        run_test_tty_file_cold_25();
LAB_001782c5:
        pcStack_9a8 = (code *)0x1782ca;
        run_test_tty_file_cold_23();
      }
      pcStack_9a8 = run_test_tty_pty;
      run_test_tty_file_cold_24();
      puVar6 = auStack_d00;
      puStack_9b0 = puVar4;
      pcStack_9a8 = (code *)piVar7;
      iVar2 = uv_loop_init(puVar6);
      if (iVar2 == 0) {
        iVar2 = openpty(&uStack_f7c,&uStack_f80,0,0,auStack_f78);
        if (iVar2 != 0) {
          run_test_tty_pty_cold_2();
          return 1;
        }
        puVar6 = auStack_d00;
        iVar2 = uv_tty_init(puVar6,auStack_f70,uStack_f80,0);
        if (iVar2 != 0) goto LAB_00178460;
        puVar6 = auStack_d00;
        iVar2 = uv_tty_init(puVar6,auStack_e38,uStack_f7c,0);
        if (iVar2 != 0) goto LAB_00178465;
        puVar6 = auStack_f70;
        iVar2 = uv_is_readable(puVar6);
        if (iVar2 == 0) goto LAB_0017846a;
        puVar6 = auStack_f70;
        iVar2 = uv_is_writable(puVar6);
        if (iVar2 == 0) goto LAB_0017846f;
        puVar6 = auStack_e38;
        iVar2 = uv_is_readable(puVar6);
        if (iVar2 == 0) goto LAB_00178474;
        puVar6 = auStack_e38;
        iVar2 = uv_is_writable(puVar6);
        if (iVar2 == 0) goto LAB_00178479;
        if ((bStack_f16 & 0x10) != 0) goto LAB_0017847e;
        if ((bStack_dde & 0x10) == 0) goto LAB_00178483;
        puVar6 = (undefined1 *)(ulong)uStack_f80;
        iVar2 = close(uStack_f80);
        if (iVar2 != 0) goto LAB_00178488;
        uv_close(auStack_f70,0);
        puVar6 = (undefined1 *)(ulong)uStack_f7c;
        iVar2 = close(uStack_f7c);
        if (iVar2 != 0) goto LAB_0017848d;
        uv_close(auStack_e38,0);
        puVar6 = auStack_d00;
        iVar2 = uv_run(puVar6,0);
        if (iVar2 == 0) {
          uVar5 = uv_default_loop();
          uv_walk(uVar5,close_walk_cb,0);
          uv_run(uVar5,0);
          puVar6 = (undefined1 *)uv_default_loop();
          iVar2 = uv_loop_close(puVar6);
          if (iVar2 == 0) {
            return 0;
          }
          goto LAB_00178497;
        }
      }
      else {
        run_test_tty_pty_cold_1();
LAB_00178460:
        run_test_tty_pty_cold_3();
LAB_00178465:
        run_test_tty_pty_cold_4();
LAB_0017846a:
        run_test_tty_pty_cold_14();
LAB_0017846f:
        run_test_tty_pty_cold_13();
LAB_00178474:
        run_test_tty_pty_cold_12();
LAB_00178479:
        run_test_tty_pty_cold_11();
LAB_0017847e:
        run_test_tty_pty_cold_5();
LAB_00178483:
        run_test_tty_pty_cold_10();
LAB_00178488:
        run_test_tty_pty_cold_6();
LAB_0017848d:
        run_test_tty_pty_cold_7();
      }
      run_test_tty_pty_cold_8();
LAB_00178497:
      run_test_tty_pty_cold_9();
      iVar2 = uv_is_closing();
      if (iVar2 != 0) {
        return iVar2;
      }
      iVar2 = uv_close(puVar6,0);
      return iVar2;
    }
  }
LAB_00177e76:
  pcStack_2a0 = (code *)0x177e7b;
  run_test_tty_cold_21();
  piVar7 = (int *)0x1;
LAB_00177e81:
  return (int)piVar7;
}

Assistant:

TEST_IMPL(tty) {
  int r, width, height;
  int ttyin_fd, ttyout_fd;
  uv_tty_t tty_in, tty_out;
  uv_loop_t* loop = uv_default_loop();

  /* Make sure we have an FD that refers to a tty */
#ifdef _WIN32
  HANDLE handle;
  handle = CreateFileA("conin$",
                       GENERIC_READ | GENERIC_WRITE,
                       FILE_SHARE_READ | FILE_SHARE_WRITE,
                       NULL,
                       OPEN_EXISTING,
                       FILE_ATTRIBUTE_NORMAL,
                       NULL);
  ASSERT(handle != INVALID_HANDLE_VALUE);
  ttyin_fd = _open_osfhandle((intptr_t) handle, 0);

  handle = CreateFileA("conout$",
                       GENERIC_READ | GENERIC_WRITE,
                       FILE_SHARE_READ | FILE_SHARE_WRITE,
                       NULL,
                       OPEN_EXISTING,
                       FILE_ATTRIBUTE_NORMAL,
                       NULL);
  ASSERT(handle != INVALID_HANDLE_VALUE);
  ttyout_fd = _open_osfhandle((intptr_t) handle, 0);

#else /* unix */
  ttyin_fd = open("/dev/tty", O_RDONLY, 0);
  if (ttyin_fd < 0) {
    fprintf(stderr, "Cannot open /dev/tty as read-only: %s\n", strerror(errno));
    fflush(stderr);
    return TEST_SKIP;
  }

  ttyout_fd = open("/dev/tty", O_WRONLY, 0);
  if (ttyout_fd < 0) {
    fprintf(stderr, "Cannot open /dev/tty as write-only: %s\n", strerror(errno));
    fflush(stderr);
    return TEST_SKIP;
  }
#endif

  ASSERT(ttyin_fd >= 0);
  ASSERT(ttyout_fd >= 0);

  ASSERT(UV_UNKNOWN_HANDLE == uv_guess_handle(-1));

  ASSERT(UV_TTY == uv_guess_handle(ttyin_fd));
  ASSERT(UV_TTY == uv_guess_handle(ttyout_fd));

  r = uv_tty_init(uv_default_loop(), &tty_in, ttyin_fd, 1);  /* Readable. */
  ASSERT(r == 0);
  ASSERT(uv_is_readable((uv_stream_t*) &tty_in));
  ASSERT(!uv_is_writable((uv_stream_t*) &tty_in));

  r = uv_tty_init(uv_default_loop(), &tty_out, ttyout_fd, 0);  /* Writable. */
  ASSERT(r == 0);
  ASSERT(!uv_is_readable((uv_stream_t*) &tty_out));
  ASSERT(uv_is_writable((uv_stream_t*) &tty_out));

  r = uv_tty_get_winsize(&tty_out, &width, &height);
  ASSERT(r == 0);

  printf("width=%d height=%d\n", width, height);

  if (width == 0 && height == 0) {
   /* Some environments such as containers or Jenkins behave like this
    * sometimes */
    MAKE_VALGRIND_HAPPY();
    return TEST_SKIP;
  }

  /*
   * Is it a safe assumption that most people have terminals larger than
   * 10x10?
   */
  ASSERT(width > 10);
  ASSERT(height > 10);

  /* Turn on raw mode. */
  r = uv_tty_set_mode(&tty_in, UV_TTY_MODE_RAW);
  ASSERT(r == 0);

  /* Turn off raw mode. */
  r = uv_tty_set_mode(&tty_in, UV_TTY_MODE_NORMAL);
  ASSERT(r == 0);

  /* Calling uv_tty_reset_mode() repeatedly should not clobber errno. */
  errno = 0;
  ASSERT(0 == uv_tty_reset_mode());
  ASSERT(0 == uv_tty_reset_mode());
  ASSERT(0 == uv_tty_reset_mode());
  ASSERT(0 == errno);

  /* TODO check the actual mode! */

  uv_close((uv_handle_t*) &tty_in, NULL);
  uv_close((uv_handle_t*) &tty_out, NULL);

  uv_run(loop, UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}